

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

void * __thiscall
asmjit::ZoneAllocator::_alloc(ZoneAllocator *this,size_t size,size_t *allocatedSize)

{
  DynamicBlock *pDVar1;
  Slot *pSVar2;
  uint uVar3;
  DynamicBlock *pDVar4;
  Zone *pZVar5;
  void *pvVar6;
  void *extraout_RAX;
  int iVar7;
  Zone *pZVar8;
  size_t *allocatedSize_00;
  size_t *unaff_RBX;
  uint uVar9;
  Zone *size_00;
  ZoneAllocator *this_00;
  Zone *pZVar10;
  ulong uVar11;
  
  this_00 = (ZoneAllocator *)this->_zone;
  if (this_00 == (ZoneAllocator *)0x0) {
    _alloc();
LAB_00123043:
    _alloc();
  }
  else {
    if (size == 0) goto LAB_00123043;
    if (size < 0x201) {
      if (size < 0x81) {
        uVar3 = (uint)(size + 0x1fffffffff >> 5);
        uVar9 = 0x1e0;
        iVar7 = 0x1f;
      }
      else {
        uVar3 = (int)(size + 0x3fffffff7f >> 6) + 4;
        uVar9 = 0x7c0;
        iVar7 = 0x3f;
      }
      size_00 = (Zone *)(ulong)(uVar9 & iVar7 + (int)size);
      *allocatedSize = (size_t)size_00;
      pSVar2 = this->_slots[uVar3];
      if (pSVar2 != (Slot *)0x0) {
        this->_slots[uVar3] = pSVar2->next;
        return pSVar2;
      }
      pZVar10 = (Zone *)this_00->_slots[0];
      pZVar5 = (Zone *)((ulong)((long)&this_00->_zone->field_3 + 7U) & 0xffffffffffffffe0);
      if (pZVar10 < pZVar5) {
        pZVar5 = pZVar10;
      }
      this_00->_zone = pZVar5;
      pZVar8 = (Zone *)((long)pZVar10 - (long)pZVar5);
      if (pZVar8 < size_00) {
        if ((Zone *)0x1f < pZVar8) {
          do {
            pZVar10 = (Zone *)0x80;
            if (pZVar8 < (Zone *)0x80) {
              pZVar10 = pZVar8;
            }
            uVar11 = (ulong)((int)pZVar10 + 0x60U >> 2 & 0x18);
            pZVar5->_ptr = (uint8_t *)*(Slot **)((long)this->_slots + uVar11);
            *(Zone **)((long)this->_slots + uVar11) = pZVar5;
            pZVar5 = (Zone *)((long)&pZVar10->_ptr + (long)&pZVar5->_ptr);
            pZVar8 = (Zone *)((long)pZVar8 - (long)pZVar10);
          } while ((Zone *)0x1f < pZVar8);
          if ((pZVar5 < this_00->_zone) || ((Zone *)this_00->_slots[0] < pZVar5)) goto LAB_001230bc;
          this_00->_zone = pZVar5;
        }
        pvVar6 = Zone::_alloc((Zone *)this_00,(size_t)size_00,0x20);
        if (pvVar6 == (void *)0x0) {
          *allocatedSize = 0;
          return (void *)0x0;
        }
        return pvVar6;
      }
      size_00 = (Zone *)((long)&pZVar5->_ptr + (long)&size_00->_ptr);
      if (size_00 <= pZVar10) {
        this_00->_zone = size_00;
        return pZVar5;
      }
      _alloc();
LAB_001230bc:
      _alloc();
      if (this_00->_zone == (Zone *)0x0) {
        _allocZeroed();
        pvVar6 = extraout_RAX;
      }
      else {
        pvVar6 = _alloc(this_00,(size_t)size_00,allocatedSize_00);
        if (pvVar6 != (void *)0x0) {
          pvVar6 = memset(pvVar6,0,*allocatedSize_00);
          return pvVar6;
        }
      }
      return pvVar6;
    }
    if (0xffffffffffffffc6 < size) {
      return (void *)0x0;
    }
    pDVar4 = (DynamicBlock *)malloc(size + 0x38);
    unaff_RBX = allocatedSize;
    if (pDVar4 != (DynamicBlock *)0x0) {
      pDVar1 = this->_dynamicBlocks;
      if (pDVar1 != (DynamicBlock *)0x0) {
        pDVar1->prev = pDVar4;
      }
      pDVar4->prev = (DynamicBlock *)0x0;
      pDVar4->next = pDVar1;
      this->_dynamicBlocks = pDVar4;
      pvVar6 = (void *)((ulong)((long)&pDVar4[3].prev + 7U) & 0xffffffffffffffe0);
      *(DynamicBlock **)((long)pvVar6 - 8) = pDVar4;
      goto LAB_00122fc3;
    }
  }
  size = 0;
  pvVar6 = (void *)0x0;
LAB_00122fc3:
  *unaff_RBX = size;
  return pvVar6;
}

Assistant:

void* ZoneAllocator::_alloc(size_t size, size_t& allocatedSize) noexcept {
  ASMJIT_ASSERT(isInitialized());

  // Use the memory pool only if the requested block has a reasonable size.
  uint32_t slot;
  if (_getSlotIndex(size, slot, allocatedSize)) {
    // Slot reuse.
    uint8_t* p = reinterpret_cast<uint8_t*>(_slots[slot]);
    size = allocatedSize;

    if (p) {
      _slots[slot] = reinterpret_cast<Slot*>(p)->next;
      return p;
    }

    _zone->align(kBlockAlignment);
    p = _zone->ptr();
    size_t remain = (size_t)(_zone->end() - p);

    if (ASMJIT_LIKELY(remain >= size)) {
      _zone->setPtr(p + size);
      return p;
    }
    else {
      // Distribute the remaining memory to suitable slots, if possible.
      if (remain >= kLoGranularity) {
        do {
          size_t distSize = Support::min<size_t>(remain, kLoMaxSize);
          uint32_t distSlot = uint32_t((distSize - kLoGranularity) / kLoGranularity);
          ASMJIT_ASSERT(distSlot < kLoCount);

          reinterpret_cast<Slot*>(p)->next = _slots[distSlot];
          _slots[distSlot] = reinterpret_cast<Slot*>(p);

          p += distSize;
          remain -= distSize;
        } while (remain >= kLoGranularity);
        _zone->setPtr(p);
      }

      p = static_cast<uint8_t*>(_zone->_alloc(size, kBlockAlignment));
      if (ASMJIT_UNLIKELY(!p)) {
        allocatedSize = 0;
        return nullptr;
      }

      return p;
    }
  }
  else {
    // Allocate a dynamic block.
    size_t kBlockOverhead = sizeof(DynamicBlock) + sizeof(DynamicBlock*) + kBlockAlignment;

    // Handle a possible overflow.
    if (ASMJIT_UNLIKELY(kBlockOverhead >= SIZE_MAX - size))
      return nullptr;

    void* p = ::malloc(size + kBlockOverhead);
    if (ASMJIT_UNLIKELY(!p)) {
      allocatedSize = 0;
      return nullptr;
    }

    // Link as first in `_dynamicBlocks` double-linked list.
    DynamicBlock* block = static_cast<DynamicBlock*>(p);
    DynamicBlock* next = _dynamicBlocks;

    if (next)
      next->prev = block;

    block->prev = nullptr;
    block->next = next;
    _dynamicBlocks = block;

    // Align the pointer to the guaranteed alignment and store `DynamicBlock`
    // at the beginning of the memory block, so `_releaseDynamic()` can find it.
    p = Support::alignUp(static_cast<uint8_t*>(p) + sizeof(DynamicBlock) + sizeof(DynamicBlock*), kBlockAlignment);
    reinterpret_cast<DynamicBlock**>(p)[-1] = block;

    allocatedSize = size;
    return p;
  }
}